

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RowSetEntry * rowSetEntryAlloc(RowSet *p)

{
  RowSetChunk *pRVar1;
  RowSetEntry *pRVar2;
  u16 uVar3;
  
  if (p->nFresh == 0) {
    pRVar1 = (RowSetChunk *)sqlite3DbMallocRawNN(p->db,0x3f8);
    if (pRVar1 == (RowSetChunk *)0x0) {
      return (RowSetEntry *)0x0;
    }
    pRVar1->pNextChunk = p->pChunk;
    p->pChunk = pRVar1;
    pRVar2 = pRVar1->aEntry;
    uVar3 = 0x29;
  }
  else {
    pRVar2 = p->pFresh;
    uVar3 = p->nFresh - 1;
  }
  p->nFresh = uVar3;
  p->pFresh = pRVar2 + 1;
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetEntryAlloc(RowSet *p){
  assert( p!=0 );
  if( p->nFresh==0 ){  /*OPTIMIZATION-IF-FALSE*/
    /* We could allocate a fresh RowSetEntry each time one is needed, but it
    ** is more efficient to pull a preallocated entry from the pool */
    struct RowSetChunk *pNew;
    pNew = sqlite3DbMallocRawNN(p->db, sizeof(*pNew));
    if( pNew==0 ){
      return 0;
    }
    pNew->pNextChunk = p->pChunk;
    p->pChunk = pNew;
    p->pFresh = pNew->aEntry;
    p->nFresh = ROWSET_ENTRY_PER_CHUNK;
  }
  p->nFresh--;
  return p->pFresh++;
}